

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

double pieceCountScore(game *Game)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double score;
  game *Game_local;
  
  iVar1 = boardCount((Game->boards).WK);
  iVar2 = boardCount((Game->boards).WQ);
  iVar3 = boardCount((Game->boards).WB);
  iVar4 = boardCount((Game->boards).WN);
  iVar5 = boardCount((Game->boards).WR);
  iVar6 = boardCount((Game->boards).WP);
  iVar7 = boardCount((Game->boards).BK);
  iVar8 = boardCount((Game->boards).BQ);
  iVar9 = boardCount((Game->boards).BB);
  iVar10 = boardCount((Game->boards).BN);
  iVar11 = boardCount((Game->boards).BR);
  iVar12 = boardCount((Game->boards).BP);
  return ((double)iVar11 * -5.0 +
         (double)iVar10 * -3.0 +
         (double)iVar9 * -3.0 +
         (double)iVar8 * -9.0 +
         (double)iVar7 * -100.0 +
         (double)iVar6 +
         (double)iVar5 * 5.0 +
         (double)iVar4 * 3.0 +
         (double)iVar3 * 3.0 + (double)iVar2 * 9.0 + (double)iVar1 * 100.0 + 0.0) - (double)iVar12;
}

Assistant:

double pieceCountScore(const game Game) {
  double score = 0.0;

  score += 100.0 * (double)boardCount(Game.boards.WK);
  score += 9.0 * (double)boardCount(Game.boards.WQ);
  score += 3.0 * (double)boardCount(Game.boards.WB);
  score += 3.0 * (double)boardCount(Game.boards.WN);
  score += 5.0 * (double)boardCount(Game.boards.WR);
  score += 1.0 * (double)boardCount(Game.boards.WP);

  score -= 100.0 * (double)boardCount(Game.boards.BK);
  score -= 9.0 * (double)boardCount(Game.boards.BQ);
  score -= 3.0 * (double)boardCount(Game.boards.BB);
  score -= 3.0 * (double)boardCount(Game.boards.BN);
  score -= 5.0 * (double)boardCount(Game.boards.BR);
  score -= 1.0 * (double)boardCount(Game.boards.BP);

  return score;
}